

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.c
# Opt level: O3

double rhs_2nd_equation(double x,double t,Gas_parameters *parameters)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar3 = t * 6.283185307179586;
  dVar4 = sin(dVar3);
  dVar5 = x * 3.141592653589793 * x * 0.01;
  dVar6 = sin(dVar5);
  dVar7 = cos(dVar3);
  dVar8 = sin(dVar5);
  dVar9 = cos(dVar3);
  dVar10 = cos(dVar5);
  dVar1 = parameters->p_ro;
  dVar11 = sin(x * 0.3141592653589793);
  dVar12 = cos(x * 0.3141592653589793);
  dVar2 = parameters->viscosity;
  dVar13 = cos(x * 3.141592653589793 * 0.1);
  dVar13 = log(dVar13 + 1.5);
  dVar13 = exp(-(dVar13 + t));
  dVar3 = cos(dVar3);
  dVar14 = cos(dVar5);
  dVar5 = sin(dVar5);
  return (dVar5 * x * -0.06283185307179587 * x + dVar14) * dVar3 * -0.06283185307179587 *
         dVar13 * dVar2 +
         ((dVar11 * -0.3141592653589793) / (dVar12 + 1.5)) * dVar1 +
         dVar10 * dVar9 * x * 0.06283185307179587 * dVar8 * dVar7 +
         dVar6 * dVar4 * -6.283185307179586;
}

Assistant:

double rhs_2nd_equation (double x, double t, Gas_parameters const * parameters) {
  return u_t (x, t) + 
          u_exact (x, t) * u_x (x, t) + 
          parameters->p_ro * g_x (x, t) -
          parameters->viscosity * exp_1 (g_exact (x, t)) * u_xx (x, t);
}